

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_935bd6::HandleUploadCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  byte bVar3;
  bool bVar4;
  CURLcode CVar5;
  string *psVar6;
  long lVar7;
  FILE *__stream;
  unsigned_long uVar8;
  CURL_conflict *data;
  curl_slist *list;
  char *extraout_RDX;
  cURLProgressHelper *this;
  string *h;
  pointer pbVar9;
  bool bVar10;
  string_view value;
  string_view value_00;
  string_view value_01;
  undefined7 in_stack_fffffffffffffd58;
  cURLProgressHelper helper;
  string e_12;
  long local_240;
  cURLEasyGuard g_curl;
  string err;
  cmFileCommandVectorOfChar chunkDebug;
  string *local_1e0;
  cmFileCommandVectorOfChar chunkResponse;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string logVar;
  string filename;
  string netrc_level;
  string userpwd;
  string statusVar;
  string url;
  string local_d8;
  string local_b8;
  string local_98;
  string netrc_file;
  char *local_58;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&helper,"UPLOAD must be called with at least three arguments.",
               (allocator<char> *)&e_12);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&helper);
    return false;
  }
  std::__cxx11::string::string((string *)&filename,(string *)(pbVar1 + 1));
  std::__cxx11::string::string((string *)&url,(string *)(pbVar1 + 2));
  logVar._M_dataplus._M_p = (pointer)&logVar.field_2;
  logVar._M_string_length = 0;
  statusVar._M_dataplus._M_p = (pointer)&statusVar.field_2;
  statusVar._M_string_length = 0;
  logVar.field_2._M_local_buf[0] = '\0';
  statusVar.field_2._M_local_buf[0] = '\0';
  pcVar2 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&helper,"CMAKE_TLS_VERIFY",(allocator<char> *)&e_12);
  bVar3 = cmMakefile::IsOn(pcVar2,(string *)&helper);
  std::__cxx11::string::~string((string *)&helper);
  pcVar2 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&helper,"CMAKE_TLS_CAINFO",(allocator<char> *)&e_12);
  local_1e0 = (string *)cmMakefile::GetDefinition(pcVar2,(string *)&helper);
  std::__cxx11::string::~string((string *)&helper);
  userpwd._M_dataplus._M_p = (pointer)&userpwd.field_2;
  userpwd._M_string_length = 0;
  userpwd.field_2._M_local_buf[0] = '\0';
  pcVar2 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&helper,"CMAKE_NETRC",(allocator<char> *)&e_12);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&helper);
  std::__cxx11::string::string((string *)&netrc_level,(string *)psVar6);
  std::__cxx11::string::~string((string *)&helper);
  pcVar2 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&helper,"CMAKE_NETRC_FILE",(allocator<char> *)&e_12);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&helper);
  std::__cxx11::string::string((string *)&netrc_file,(string *)psVar6);
  std::__cxx11::string::~string((string *)&helper);
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar10 = false;
  lVar7 = 0;
  local_240 = 0;
  for (psVar6 = pbVar1 + 3;
      psVar6 != (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; psVar6 = psVar6 + 1) {
    bVar4 = std::operator==(psVar6,"TIMEOUT");
    if (bVar4) {
      psVar6 = psVar6 + 1;
      if (psVar6 == (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&helper,"UPLOAD missing time for TIMEOUT.",(allocator<char> *)&e_12);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002786ab:
        this = &helper;
        goto LAB_002786b0;
      }
      local_240 = atol((psVar6->_M_dataplus)._M_p);
    }
    else {
      bVar4 = std::operator==(psVar6,"INACTIVITY_TIMEOUT");
      if (bVar4) {
        psVar6 = psVar6 + 1;
        if (psVar6 == (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD missing time for INACTIVITY_TIMEOUT.",
                     (allocator<char> *)&e_12);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002786ab;
        }
        lVar7 = atol((psVar6->_M_dataplus)._M_p);
      }
      else {
        bVar4 = std::operator==(psVar6,"LOG");
        if (bVar4) {
          if (psVar6 + 1 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&helper,"UPLOAD missing VAR for LOG.",(allocator<char> *)&e_12);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002786ab;
          }
          std::__cxx11::string::_M_assign((string *)&logVar);
          psVar6 = psVar6 + 1;
        }
        else {
          bVar4 = std::operator==(psVar6,"STATUS");
          if (bVar4) {
            if (psVar6 + 1 ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&helper,"UPLOAD missing VAR for STATUS.",(allocator<char> *)&e_12
                        );
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002786ab;
            }
            std::__cxx11::string::_M_assign((string *)&statusVar);
            psVar6 = psVar6 + 1;
          }
          else {
            bVar4 = std::operator==(psVar6,"SHOW_PROGRESS");
            if (bVar4) {
              bVar10 = true;
            }
            else {
              bVar4 = std::operator==(psVar6,"TLS_VERIFY");
              if (bVar4) {
                if (psVar6 + 1 ==
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&helper,"UPLOAD missing bool value for TLS_VERIFY.",
                             (allocator<char> *)&e_12);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                  goto LAB_002786ab;
                }
                value._M_str = extraout_RDX;
                value._M_len = (size_t)psVar6[1]._M_dataplus._M_p;
                bVar3 = cmValue::IsOn((cmValue *)psVar6[1]._M_string_length,value);
                psVar6 = psVar6 + 1;
              }
              else {
                bVar4 = std::operator==(psVar6,"TLS_CAINFO");
                if (bVar4) {
                  psVar6 = psVar6 + 1;
                  local_1e0 = psVar6;
                  if (psVar6 == (args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&helper,"UPLOAD missing file value for TLS_CAINFO.",
                               (allocator<char> *)&e_12);
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    goto LAB_002786ab;
                  }
                }
                else {
                  bVar4 = std::operator==(psVar6,"NETRC_FILE");
                  if (bVar4) {
                    psVar6 = psVar6 + 1;
                    if (psVar6 == (args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&helper,"UPLOAD missing file value for NETRC_FILE.",
                                 (allocator<char> *)&e_12);
                      std::__cxx11::string::_M_assign((string *)&status->Error);
                      goto LAB_002786ab;
                    }
                    std::__cxx11::string::_M_assign((string *)&netrc_file);
                  }
                  else {
                    bVar4 = std::operator==(psVar6,"NETRC");
                    if (bVar4) {
                      psVar6 = psVar6 + 1;
                      if (psVar6 == (args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&helper,"UPLOAD missing level value for NETRC.",
                                   (allocator<char> *)&e_12);
                        std::__cxx11::string::_M_assign((string *)&status->Error);
                        goto LAB_002786ab;
                      }
                      std::__cxx11::string::_M_assign((string *)&netrc_level);
                    }
                    else {
                      bVar4 = std::operator==(psVar6,"USERPWD");
                      if (bVar4) {
                        psVar6 = psVar6 + 1;
                        if (psVar6 == (args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&helper,"UPLOAD missing string for USERPWD.",
                                     (allocator<char> *)&e_12);
                          std::__cxx11::string::_M_assign((string *)&status->Error);
                          goto LAB_002786ab;
                        }
                        std::__cxx11::string::_M_assign((string *)&userpwd);
                      }
                      else {
                        bVar4 = std::operator==(psVar6,"HTTPHEADER");
                        if (bVar4) {
                          psVar6 = psVar6 + 1;
                          if (psVar6 == (args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&helper,"UPLOAD missing string for HTTPHEADER.",
                                       (allocator<char> *)&e_12);
                            std::__cxx11::string::_M_assign((string *)&status->Error);
                            goto LAB_002786ab;
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(&curl_headers,psVar6);
                        }
                        else {
                          helper.CurrentPercentage = 0x15;
                          helper.Makefile = (cmMakefile *)anon_var_dwarf_93564f;
                          e_12._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
                          e_12._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
                          cmStrCat<>(&err,(cmAlphaNum *)&helper,(cmAlphaNum *)&e_12);
                          cmMakefile::IssueMessage(status->Makefile,AUTHOR_WARNING,&err);
                          std::__cxx11::string::~string((string *)&err);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __stream = (FILE *)cmsys::SystemTools::Fopen(&filename,"rb");
  if (__stream == (FILE *)0x0) {
    helper.CurrentPercentage = 0x19;
    helper.Makefile = (cmMakefile *)anon_var_dwarf_935a37;
    e_12._M_dataplus._M_p = (pointer)filename._M_string_length;
    e_12._M_string_length = (size_type)filename._M_dataplus._M_p;
    cmStrCat<char[15]>(&err,(cmAlphaNum *)&helper,(cmAlphaNum *)&e_12,
                       (char (*) [15])"\' for reading.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    this = (cURLProgressHelper *)&err;
LAB_002786b0:
    std::__cxx11::string::~string((string *)this);
  }
  else {
    uVar8 = cmsys::SystemTools::FileLength(&filename);
    std::__cxx11::string::string((string *)&local_50,(string *)&url);
    cmCurlFixFileURL((string *)&helper,&local_50);
    std::__cxx11::string::operator=((string *)&url,(string *)&helper);
    std::__cxx11::string::~string((string *)&helper);
    std::__cxx11::string::~string((string *)&local_50);
    curl_global_init(3);
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      g_curl.Easy = data;
      CVar5 = curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
      if (CVar5 == CURLE_OK) {
        CVar5 = curl_easy_setopt(data,CURLOPT_UPLOAD,1);
        if (CVar5 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set upload flag: ",(allocator<char> *)&e_12);
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002787fe;
        }
        CVar5 = curl_easy_setopt(data,CURLOPT_URL,url._M_dataplus._M_p);
        if (CVar5 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set url: ",(allocator<char> *)&e_12);
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002787fe;
        }
        CVar5 = curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmWriteToMemoryCallback);
        if (CVar5 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set write function: ",(allocator<char> *)&e_12
                    );
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002787fe;
        }
        CVar5 = curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmFileCommandCurlDebugCallback);
        if (CVar5 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set debug function: ",(allocator<char> *)&e_12
                    );
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002787fe;
        }
        if ((bVar3 & 1) == 0) {
          CVar5 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
          if (CVar5 == CURLE_OK) goto LAB_002789ce;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set TLS/SSL Verify off: ",
                     (allocator<char> *)&e_12);
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002787fe;
        }
        CVar5 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,1);
        if (CVar5 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&helper,"UPLOAD cannot set TLS/SSL Verify on: ",
                     (allocator<char> *)&e_12);
          curl_easy_strerror(CVar5);
          std::__cxx11::string::append((char *)&helper);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002787fe;
        }
LAB_002789ce:
        if (local_1e0 == (string *)0x0) {
          local_1e0 = &cmValue::Empty_abi_cxx11_;
        }
        cmCurlSetCAInfo(&local_98,data,local_1e0);
        if (local_98._M_string_length == 0) {
          chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          CVar5 = curl_easy_setopt(data,CURLOPT_WRITEDATA);
          if (CVar5 == CURLE_OK) {
            CVar5 = curl_easy_setopt(data,CURLOPT_DEBUGDATA,&chunkDebug);
            if (CVar5 != CURLE_OK) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&helper,"UPLOAD cannot set debug data: ",(allocator<char> *)&e_12
                        );
              curl_easy_strerror(CVar5);
              std::__cxx11::string::append((char *)&helper);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_00278b94;
            }
            CVar5 = curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
            if (CVar5 != CURLE_OK) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&helper,"UPLOAD cannot set follow-redirect option: ",
                         (allocator<char> *)&e_12);
              curl_easy_strerror(CVar5);
              std::__cxx11::string::append((char *)&helper);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_00278b94;
            }
            if ((logVar._M_string_length != 0) &&
               (CVar5 = curl_easy_setopt(data,CURLOPT_VERBOSE,1), CVar5 != CURLE_OK)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&helper,"UPLOAD cannot set verbose: ",(allocator<char> *)&e_12);
              curl_easy_strerror(CVar5);
              std::__cxx11::string::append((char *)&helper);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_00278b94;
            }
            if ((0 < local_240) &&
               (CVar5 = curl_easy_setopt(data,CURLOPT_TIMEOUT,local_240), CVar5 != CURLE_OK)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&helper,"UPLOAD cannot set timeout: ",(allocator<char> *)&e_12);
              curl_easy_strerror(CVar5);
              std::__cxx11::string::append((char *)&helper);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_00278b94;
            }
            if (0 < lVar7) {
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
              curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,lVar7);
            }
            cURLProgressHelper::cURLProgressHelper(&helper,status->Makefile,"upload");
            if (bVar10) {
              CVar5 = curl_easy_setopt(data,CURLOPT_NOPROGRESS,0);
              if (CVar5 == CURLE_OK) {
                CVar5 = curl_easy_setopt(data,CURLOPT_PROGRESSFUNCTION,cmFileUploadProgressCallback)
                ;
                if (CVar5 == CURLE_OK) {
                  CVar5 = curl_easy_setopt(data,CURLOPT_XFERINFODATA,&helper);
                  if (CVar5 == CURLE_OK) goto LAB_00278de4;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&e_12,"UPLOAD cannot set progress data: ",
                             (allocator<char> *)&err);
                  curl_easy_strerror(CVar5);
                  std::__cxx11::string::append((char *)&e_12);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&e_12,"UPLOAD cannot set progress function: ",
                             (allocator<char> *)&err);
                  curl_easy_strerror(CVar5);
                  std::__cxx11::string::append((char *)&e_12);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                }
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e_12,"UPLOAD cannot set noprogress value: ",
                           (allocator<char> *)&err);
                curl_easy_strerror(CVar5);
                std::__cxx11::string::append((char *)&e_12);
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
LAB_00278e92:
              std::__cxx11::string::~string((string *)&e_12);
              bVar10 = false;
            }
            else {
LAB_00278de4:
              CVar5 = curl_easy_setopt(data,CURLOPT_READDATA,__stream);
              if (CVar5 != CURLE_OK) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e_12,"UPLOAD cannot set input file: ",(allocator<char> *)&err)
                ;
                curl_easy_strerror(CVar5);
                std::__cxx11::string::append((char *)&e_12);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_00278e92;
              }
              CVar5 = curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar8);
              if (CVar5 != CURLE_OK) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e_12,"UPLOAD cannot set input file size: ",
                           (allocator<char> *)&err);
                curl_easy_strerror(CVar5);
                std::__cxx11::string::append((char *)&e_12);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_00278e92;
              }
              if ((userpwd._M_string_length != 0) &&
                 (CVar5 = curl_easy_setopt(data,CURLOPT_USERPWD,userpwd._M_dataplus._M_p),
                 CVar5 != CURLE_OK)) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e_12,"UPLOAD cannot set user password: ",
                           (allocator<char> *)&err);
                curl_easy_strerror(CVar5);
                std::__cxx11::string::append((char *)&e_12);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_00278e92;
              }
              cmsys::SystemTools::UpperCase(&e_12,&netrc_level);
              std::__cxx11::string::operator=((string *)&netrc_level,(string *)&e_12);
              std::__cxx11::string::~string((string *)&e_12);
              cmCurlSetNETRCOption(&local_b8,data,&netrc_level,&netrc_file);
              pbVar1 = curl_headers.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              bVar10 = local_b8._M_string_length == 0;
              if (bVar10) {
                list = (curl_slist *)0x0;
                for (pbVar9 = curl_headers.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar1;
                    pbVar9 = pbVar9 + 1) {
                  list = curl_slist_append(list,(pbVar9->_M_dataplus)._M_p);
                }
                curl_easy_setopt(data,CURLOPT_HTTPHEADER,list);
                CVar5 = curl_easy_perform(data);
                curl_slist_free_all(list);
                g_curl.Easy = (CURL *)0x0;
                curl_easy_cleanup((Curl_easy *)CONCAT17(bVar3,in_stack_fffffffffffffd58));
                if (statusVar._M_string_length != 0) {
                  pcVar2 = status->Makefile;
                  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&e_12,CVar5);
                  err._M_dataplus._M_p = (pointer)0x2;
                  err._M_string_length = (long)"\";\"" + 1;
                  local_58 = curl_easy_strerror(CVar5);
                  cmStrCat<char_const*,char[2]>
                            (&local_d8,(cmAlphaNum *)&e_12,(cmAlphaNum *)&err,&local_58,
                             (char (*) [2])0x5eaac5);
                  value_00._M_str = local_d8._M_dataplus._M_p;
                  value_00._M_len = local_d8._M_string_length;
                  cmMakefile::AddDefinition(pcVar2,&statusVar,value_00);
                  std::__cxx11::string::~string((string *)&local_d8);
                }
                curl_global_cleanup();
                fclose(__stream);
                if (logVar._M_string_length != 0) {
                  e_12._M_dataplus._M_p = (pointer)&e_12.field_2;
                  e_12._M_string_length = 0;
                  e_12.field_2._M_local_buf[0] = '\0';
                  if (chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    err._M_dataplus._M_p = err._M_dataplus._M_p & 0xffffffffffffff00;
                    std::vector<char,_std::allocator<char>_>::emplace_back<char>
                              (&chunkResponse,(char *)&err);
                    std::__cxx11::string::append((char *)&e_12);
                    std::__cxx11::string::append((char *)&e_12);
                    std::__cxx11::string::append((char *)&e_12);
                  }
                  if (chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    err._M_dataplus._M_p = err._M_dataplus._M_p & 0xffffffffffffff00;
                    std::vector<char,_std::allocator<char>_>::emplace_back<char>
                              (&chunkDebug,(char *)&err);
                    std::__cxx11::string::append((char *)&e_12);
                    std::__cxx11::string::append((char *)&e_12);
                    std::__cxx11::string::append((char *)&e_12);
                  }
                  value_01._M_str = e_12._M_dataplus._M_p;
                  value_01._M_len = e_12._M_string_length;
                  cmMakefile::AddDefinition(status->Makefile,&logVar,value_01);
                  std::__cxx11::string::~string((string *)&e_12);
                }
              }
              else {
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
              std::__cxx11::string::~string((string *)&local_b8);
            }
            std::__cxx11::string::~string((string *)&helper.Text);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&helper,"UPLOAD cannot set write data: ",(allocator<char> *)&e_12);
            curl_easy_strerror(CVar5);
            std::__cxx11::string::append((char *)&helper);
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00278b94:
            std::__cxx11::string::~string((string *)&helper);
            bVar10 = false;
          }
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&chunkDebug.super__Vector_base<char,_std::allocator<char>_>);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&chunkResponse.super__Vector_base<char,_std::allocator<char>_>);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&status->Error);
          bVar10 = false;
        }
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&helper,"UPLOAD cannot set fail on error flag: ",
                   (allocator<char> *)&e_12);
        curl_easy_strerror(CVar5);
        std::__cxx11::string::append((char *)&helper);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002787fe:
        std::__cxx11::string::~string((string *)&helper);
        bVar10 = false;
      }
      cURLEasyGuard::~cURLEasyGuard(&g_curl);
      goto LAB_00278814;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&helper,"UPLOAD error initializing curl.",(allocator<char> *)&e_12);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&helper);
    fclose(__stream);
  }
  bVar10 = false;
LAB_00278814:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&curl_headers);
  std::__cxx11::string::~string((string *)&netrc_file);
  std::__cxx11::string::~string((string *)&netrc_level);
  std::__cxx11::string::~string((string *)&userpwd);
  std::__cxx11::string::~string((string *)&statusVar);
  std::__cxx11::string::~string((string *)&logVar);
  std::__cxx11::string::~string((string *)&url);
  std::__cxx11::string::~string((string *)&filename);
  return bVar10;
}

Assistant:

bool HandleUploadCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  if (args.size() < 3) {
    status.SetError("UPLOAD must be called with at least three arguments.");
    return false;
  }
  auto i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;
  bool tls_verify = status.GetMakefile().IsOn("CMAKE_TLS_VERIFY");
  cmValue cainfo = status.GetMakefile().GetDefinition("CMAKE_TLS_CAINFO");
  std::string userpwd;
  std::string netrc_level =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC_FILE");

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmIsOn(*i);
      } else {
        status.SetError("UPLOAD missing bool value for TLS_VERIFY.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = cmValue(*i);
      } else {
        status.SetError("UPLOAD missing file value for TLS_CAINFO.");
        return false;
      }
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        status.SetError("UPLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        status.SetError("UPLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = cmStrCat("Unexpected argument: ", *i);
      status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    ++i;
  }

  // Open file for reading:
  //
  FILE* fin = cmsys::SystemTools::Fopen(filename, "rb");
  if (!fin) {
    std::string errStr =
      cmStrCat("UPLOAD cannot open file '", filename, "' for reading.");
    status.SetError(errStr);
    return false;
  }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

  url = cmCurlFixFileURL(url);

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    status.SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
  }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res =
    ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify off: ");
  }

  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    status.SetError(cainfo_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "UPLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(&status.GetMakefile(), "upload");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
  }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res =
    ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "UPLOAD cannot set user password: ");
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    status.SetError(netrc_option_err);
    return false;
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    status.GetMakefile().AddDefinition(
      statusVar,
      cmStrCat(static_cast<int>(res), ";\"", ::curl_easy_strerror(res), "\""));
  }

  ::curl_global_cleanup();

  fclose(fin);
  fin = nullptr;

  if (!logVar.empty()) {
    std::string log;

    if (!chunkResponse.empty()) {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += chunkResponse.data();
      log += "\n";
    }

    if (!chunkDebug.empty()) {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += chunkDebug.data();
      log += "\n";
    }

    status.GetMakefile().AddDefinition(logVar, log);
  }

  return true;
#else
  status.SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}